

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O0

void psh_globals_scale_widths(PSH_Globals globals,FT_UInt direction)

{
  FT_Int32 FVar1;
  PSH_DimensionRec *pPVar2;
  FT_Int32 b;
  long local_58;
  FT_Pos dist;
  FT_Pos w;
  FT_Fixed scale;
  PSH_Width stand;
  PSH_Width width;
  FT_UInt count;
  PSH_Widths stdw;
  PSH_Dimension dim;
  FT_UInt direction_local;
  PSH_Globals globals_local;
  
  pPVar2 = globals->dimension + direction;
  width._4_4_ = (pPVar2->stdw).count;
  if (width._4_4_ != 0) {
    b = (FT_Int32)pPVar2->scale_mult;
    FVar1 = FT_MulFix_x86_64((pPVar2->stdw).widths[0].org,b);
    (pPVar2->stdw).widths[0].cur = (long)FVar1;
    (pPVar2->stdw).widths[0].fit = (pPVar2->stdw).widths[0].cur + 0x20U & 0xffffffffffffffc0;
    stand = (pPVar2->stdw).widths;
    while (stand = stand + 1, width._4_4_ = width._4_4_ - 1, width._4_4_ != 0) {
      FVar1 = FT_MulFix_x86_64(stand->org,b);
      dist = (FT_Pos)FVar1;
      local_58 = dist - (pPVar2->stdw).widths[0].cur;
      if (local_58 < 0) {
        local_58 = -local_58;
      }
      if (local_58 < 0x80) {
        dist = (pPVar2->stdw).widths[0].cur;
      }
      stand->cur = dist;
      stand->fit = dist + 0x20U & 0xffffffffffffffc0;
    }
  }
  return;
}

Assistant:

static void
  psh_globals_scale_widths( PSH_Globals  globals,
                            FT_UInt      direction )
  {
    PSH_Dimension  dim   = &globals->dimension[direction];
    PSH_Widths     stdw  = &dim->stdw;
    FT_UInt        count = stdw->count;
    PSH_Width      width = stdw->widths;
    PSH_Width      stand = width;               /* standard width/height */
    FT_Fixed       scale = dim->scale_mult;


    if ( count > 0 )
    {
      width->cur = FT_MulFix( width->org, scale );
      width->fit = FT_PIX_ROUND( width->cur );

      width++;
      count--;

      for ( ; count > 0; count--, width++ )
      {
        FT_Pos  w, dist;


        w    = FT_MulFix( width->org, scale );
        dist = w - stand->cur;

        if ( dist < 0 )
          dist = -dist;

        if ( dist < 128 )
          w = stand->cur;

        width->cur = w;
        width->fit = FT_PIX_ROUND( w );
      }
    }
  }